

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_fprint_args(FILE *f,int argc,char **argv,int start,cargo_fprint_flags_t flags,
                     size_t max_width,size_t highlight_count,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [48];
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  char *ret;
  size_t max_width_local;
  cargo_fprint_flags_t flags_local;
  int start_local;
  char **argv_local;
  int argc_local;
  FILE *f_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000010;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x30;
  ap[0].reg_save_area =
       cargo_get_vfprint_args
                 (argc,argv,start,flags,max_width,highlight_count,(__va_list_tag *)local_58);
  if ((char *)ap[0].reg_save_area == (char *)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    fprintf((FILE *)f,"%s\n",ap[0].reg_save_area);
    _cargo_free(ap[0].reg_save_area);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int cargo_fprint_args(FILE *f, int argc, char **argv, int start,
                      cargo_fprint_flags_t flags, size_t max_width,
                      size_t highlight_count, ...)
{
    char *ret;
    va_list ap;
    va_start(ap, highlight_count);
    ret = cargo_get_vfprint_args(argc, argv, start, flags,
                                max_width, highlight_count, ap);
    va_end(ap);

    if (!ret)
    {
        return -1;
    }

    fprintf(f, "%s\n", ret);
    _cargo_free(ret);
    return 0;
}